

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptimeutilities.h
# Opt level: O0

void jrtplib::RTPTime::Wait(RTPTime *delay)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  bool bVar4;
  undefined1 auStack_40 [4];
  int ret;
  timespec rem;
  timespec req;
  uint64_t nanosec;
  uint64_t sec;
  RTPTime *delay_local;
  
  if (0.0 < delay->m_t) {
    uVar2 = (ulong)delay->m_t;
    rem.tv_nsec = uVar2 | (long)(delay->m_t - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
    do {
      iVar1 = nanosleep((timespec *)&rem.tv_nsec,(timespec *)auStack_40);
      rem.tv_nsec = _auStack_40;
      bVar4 = false;
      if (iVar1 == -1) {
        piVar3 = __errno_location();
        bVar4 = *piVar3 == 4;
      }
    } while (bVar4);
  }
  return;
}

Assistant:

inline void RTPTime::Wait(const RTPTime &delay)
{
	if (delay.m_t <= 0)
		return;

	uint64_t sec = (uint64_t)delay.m_t;
	uint64_t nanosec = (uint32_t)(1e9*(delay.m_t-(double)sec));

	struct timespec req,rem;
	int ret;

	req.tv_sec = (time_t)sec;
	req.tv_nsec = ((long)nanosec);
	do
	{
		ret = nanosleep(&req,&rem);
		req = rem;
	} while (ret == -1 && errno == EINTR);
}